

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O2

void __thiscall
SolidGlassMaterial::SolidGlassMaterial
          (SolidGlassMaterial *this,float coef,Texture *reflect_color,Texture *refract_color)

{
  (this->super_Material)._vptr_Material = (_func_int **)&PTR_shade_00216958;
  Texture::Texture(&this->reflectColor,reflect_color);
  Texture::Texture(&this->refractColor,refract_color);
  this->refractCoef = 1.0 / coef;
  return;
}

Assistant:

SolidGlassMaterial(float coef = 1,
		const Texture& reflect_color = Vector3f::ZERO,
		const Texture& refract_color = Vector3f::ZERO) :
		refractCoef(coef),
		reflectColor(reflect_color),refractColor(refract_color) {
		refractCoef = 1 / refractCoef;

//		r0 = (1 - refractCoef) / (1 + refractCoef); r0 *= r0;
	}